

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_object_base_graphics(parser *p)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  char *__s;
  size_t sVar4;
  kb_parsedata *d;
  char *color;
  object_base *kb;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 != (void *)0x0) {
    lVar1 = *(long *)((long)pvVar3 + 0xb0);
    if (lVar1 == 0) {
      p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      __s = parser_getsym(p,"color");
      sVar4 = strlen(__s);
      if (sVar4 < 2) {
        iVar2 = color_char_to_attr(*__s);
        *(int *)(lVar1 + 0x20) = iVar2;
      }
      else {
        iVar2 = color_text_to_attr(__s);
        *(int *)(lVar1 + 0x20) = iVar2;
      }
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    return p_local._4_4_;
  }
  __assert_fail("d",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                ,0x217,"enum parser_error parse_object_base_graphics(struct parser *)");
}

Assistant:

static enum parser_error parse_object_base_graphics(struct parser *p) {
	struct object_base *kb;
	const char *color;
	struct kb_parsedata *d = parser_priv(p);

	assert(d);
	kb = d->kb;
	if (!kb) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	color = parser_getsym(p, "color");
	if (strlen(color) > 1) {
		kb->attr = color_text_to_attr(color);
	} else {
		kb->attr = color_char_to_attr(color[0]);
	}
	return PARSE_ERROR_NONE;
}